

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::
RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD> *this)

{
  bool bVar1;
  undefined1 condition;
  undefined1 uVar2;
  int iVar3;
  pointer pIVar4;
  ulong uVar5;
  element_type *peVar6;
  FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>
  *a_param;
  ostream *poVar7;
  size_type sVar8;
  void *this_00;
  char *filename;
  undefined4 extraout_var;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  bool in_stack_00000117;
  CodeLocation *in_stack_00000118;
  string *in_stack_00000120;
  string param_name;
  Message test_name_stream;
  iterator param_it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  string test_suite_name;
  int line;
  char *file;
  ParamNameGeneratorFunc *name_func;
  ParamGenerator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
  generator;
  string *instantiation_name;
  iterator gen_it;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>
  test_info;
  iterator test_it;
  bool generated_instantiations;
  CodeLocation *in_stack_fffffffffffffca8;
  CodeLocation *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcc0;
  value_type *in_stack_fffffffffffffcc8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffcd8;
  pointer in_stack_fffffffffffffce0;
  CodeLocation *in_stack_fffffffffffffcf8;
  FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>
  *in_stack_fffffffffffffd18;
  int line_00;
  char *in_stack_fffffffffffffd20;
  Message *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  void *in_stack_fffffffffffffd88;
  CodeLocation *in_stack_fffffffffffffd90;
  ostream *in_stack_fffffffffffffd98;
  ostream *in_stack_fffffffffffffda0;
  ostream *in_stack_fffffffffffffda8;
  ostream *in_stack_fffffffffffffdb0;
  undefined6 in_stack_fffffffffffffdc0;
  ParamNameGeneratorFunc *tear_down_tc;
  FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>
  *in_stack_fffffffffffffe58;
  string local_188 [32];
  _Base_ptr local_168;
  undefined1 local_160;
  GTestLog local_158;
  GTestLog local_154;
  TestParamInfo<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
  local_150;
  string local_130 [3];
  size_t local_c8;
  string local_c0 [32];
  string local_a0 [36];
  int local_7c;
  char *local_78;
  ParamNameGeneratorFunc *local_70;
  undefined1 local_58 [16];
  pointer local_48;
  InstantiationInfo *local_40;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo>_>_>
  local_38 [3];
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>
  *local_20;
  __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_>_>_>
  local_18;
  byte local_9;
  
  local_9 = 0;
  local_18._M_current =
       (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>
        *)std::
          vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_>_>
          ::begin((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_>_>
                   *)in_stack_fffffffffffffca8);
  while( true ) {
    local_20 = (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>
                *)std::
                  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_>_>
                  ::end((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_>_>
                         *)in_stack_fffffffffffffca8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffcb0,
                       (__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffca8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_>_>_>
    ::operator*(&local_18);
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>
    ::shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>
                  *)in_stack_fffffffffffffcb0,
                 (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>
                  *)in_stack_fffffffffffffca8);
    local_38[0]._M_current =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo>_>
         ::begin((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo>_>
                  *)in_stack_fffffffffffffca8);
    while( true ) {
      local_40 = (InstantiationInfo *)
                 std::
                 vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo>_>
                 ::end((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo>_>
                        *)in_stack_fffffffffffffca8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffcb0,
                         (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffca8);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo>_>_>
                 ::operator->(local_38);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo>_>_>
               ::operator->(local_38);
      (*pIVar4->generator)(local_58);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_70 = pIVar4->name_func;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_78 = pIVar4->file;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_7c = pIVar4->line;
      std::__cxx11::string::string(local_a0);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
        std::__cxx11::string::operator=(local_a0,local_c0);
        std::__cxx11::string::~string(local_c0);
      }
      peVar6 = std::
               __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0xa7d2ae);
      std::__cxx11::string::operator+=(local_a0,(string *)peVar6);
      local_c8 = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0xa7d2d9);
      ParamGenerator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
      ::begin((ParamGenerator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
               *)in_stack_fffffffffffffcb8);
      while( true ) {
        ParamGenerator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
        ::end((ParamGenerator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
               *)in_stack_fffffffffffffcb8);
        bVar1 = ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
                ::operator!=((ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
                              *)in_stack_fffffffffffffcb0,
                             (ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
                              *)in_stack_fffffffffffffca8);
        ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
        ::~ParamIterator((ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
                          *)0xa7d334);
        iVar3 = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        line_00 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
        if (!bVar1) break;
        local_9 = 1;
        Message::Message((Message *)in_stack_fffffffffffffce0);
        tear_down_tc = local_70;
        a_param = ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
                  ::operator*((ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
                               *)0xa7d3dd);
        TestParamInfo<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
        ::TestParamInfo(&local_150,a_param,local_c8);
        (*tear_down_tc)(local_130,&local_150);
        condition = IsValidParamName(in_stack_fffffffffffffcb8);
        uVar2 = IsTrue((bool)condition);
        if (!(bool)uVar2) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                             in_stack_fffffffffffffd20,line_00);
          poVar7 = GTestLog::GetStream(&local_154);
          poVar7 = std::operator<<(poVar7,"Condition IsValidParamName(param_name) failed. ");
          in_stack_fffffffffffffdb0 = std::operator<<(poVar7,"Parameterized test name \'");
          in_stack_fffffffffffffda8 = std::operator<<(in_stack_fffffffffffffdb0,(string *)local_130)
          ;
          in_stack_fffffffffffffda0 =
               std::operator<<(in_stack_fffffffffffffda8,"\' is invalid, in ");
          in_stack_fffffffffffffd98 = std::operator<<(in_stack_fffffffffffffda0,local_78);
          in_stack_fffffffffffffd90 =
               (CodeLocation *)std::operator<<(in_stack_fffffffffffffd98," line ");
          in_stack_fffffffffffffd88 =
               (void *)std::ostream::operator<<(in_stack_fffffffffffffd90,local_7c);
          std::ostream::operator<<(in_stack_fffffffffffffd88,std::endl<char,std::char_traits<char>>)
          ;
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffcb0);
        }
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        bVar1 = IsTrue(sVar8 == 0);
        if (!bVar1) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                             in_stack_fffffffffffffd20,line_00);
          poVar7 = GTestLog::GetStream(&local_158);
          poVar7 = std::operator<<(poVar7,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar7 = std::operator<<(poVar7,"Duplicate parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)local_130);
          poVar7 = std::operator<<(poVar7,"\', in ");
          poVar7 = std::operator<<(poVar7,local_78);
          poVar7 = std::operator<<(poVar7," line ");
          this_00 = (void *)std::ostream::operator<<(poVar7,local_7c);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffcb0);
        }
        pVar9 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        local_168 = (_Base_ptr)pVar9.first._M_node;
        in_stack_fffffffffffffd37 = pVar9.second;
        local_160 = in_stack_fffffffffffffd37;
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0xa7d7c6);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::
          __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0xa7d7e3);
          in_stack_fffffffffffffd28 =
               Message::operator<<((Message *)in_stack_fffffffffffffcb0,
                                   &in_stack_fffffffffffffca8->file);
          Message::operator<<((Message *)in_stack_fffffffffffffcb0,
                              (char (*) [2])in_stack_fffffffffffffca8);
        }
        Message::operator<<((Message *)in_stack_fffffffffffffcb0,&in_stack_fffffffffffffca8->file);
        in_stack_fffffffffffffd20 = (char *)std::__cxx11::string::c_str();
        Message::GetString_abi_cxx11_((Message *)in_stack_fffffffffffffcb8);
        std::__cxx11::string::c_str();
        in_stack_fffffffffffffd18 =
             ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
             ::operator*((ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
                          *)0xa7d878);
        PrintToString<libaom_test::FuncParam<void(*)(unsigned_char*,unsigned_int,unsigned_char_const*,unsigned_int,unsigned_char_const*,unsigned_int,unsigned_char_const*,int,int,int)>>
                  (in_stack_fffffffffffffe58);
        std::__cxx11::string::c_str();
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0xa7d8b2);
        CodeLocation::CodeLocation(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        filename = (char *)(**(code **)(*in_RDI + 0x18))();
        in_stack_fffffffffffffca8 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::BlendA64Mask1DTestHBD>::GetSetUpCaseOrSuite
                       (filename,iVar3);
        in_stack_fffffffffffffcb0 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::BlendA64Mask1DTestHBD>::GetTearDownCaseOrSuite
                       (filename,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0xa7d923);
        in_stack_fffffffffffffce0 =
             std::
             unique_ptr<testing::internal::TestMetaFactoryBase<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>_>_>
             ::operator->((unique_ptr<testing::internal::TestMetaFactoryBase<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>_>_>
                           *)0xa7d92f);
        ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
        ::operator*((ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
                     *)0xa7d941);
        iVar3 = (*in_stack_fffffffffffffce0->_vptr_TestMetaFactoryBase[2])();
        in_stack_fffffffffffffcb8 = (string *)CONCAT44(extraout_var,iVar3);
        in_stack_fffffffffffffcd8 = in_stack_fffffffffffffcb8;
        in_stack_fffffffffffffcf8 = in_stack_fffffffffffffca8;
        MakeAndRegisterTestInfo
                  ((char *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                   (char *)in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                   (SetUpTestSuiteFunc)CONCAT17(condition,CONCAT16(uVar2,in_stack_fffffffffffffdc0))
                   ,(TearDownTestSuiteFunc)tear_down_tc,(TestFactoryBase *)a_param);
        CodeLocation::~CodeLocation((CodeLocation *)0xa7d9e4);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
        std::__cxx11::string::~string(local_188);
        std::__cxx11::string::~string((string *)local_130);
        Message::~Message((Message *)0xa7da18);
        ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
        ::operator++((ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
                      *)in_stack_fffffffffffffcb0);
        local_c8 = local_c8 + 1;
      }
      ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
      ::~ParamIterator((ParamIterator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
                        *)0xa7d34c);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xa7dadd);
      std::__cxx11::string::~string(local_a0);
      ParamGenerator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
      ::~ParamGenerator((ParamGenerator<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>_>
                         *)0xa7daf7);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::InstantiationInfo>_>_>
      ::operator++(local_38);
    }
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>
    ::~shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>
                   *)0xa7db3f);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_>_>_>
    ::operator++(&local_18);
  }
  if ((local_9 & 1) == 0) {
    (**(code **)(*in_RDI + 0x10))();
    CodeLocation::CodeLocation(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    std::
    vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_>_>
    ::empty((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTestHBD>::TestInfo>_>_>
             *)in_stack_fffffffffffffcc0);
    InsertSyntheticTestCase(in_stack_00000120,in_stack_00000118,in_stack_00000117);
    CodeLocation::~CodeLocation((CodeLocation *)0xa7dbd9);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }